

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

CRef __thiscall
Glucose::ClauseAllocator::alloc<Glucose::Clause>
          (ClauseAllocator *this,Clause *ps,bool learnt,bool imported)

{
  Ref RVar1;
  undefined7 in_register_00000009;
  uint _extra_size;
  
  _extra_size = 3;
  if ((int)CONCAT71(in_register_00000009,imported) == 0) {
    _extra_size = (uint)(byte)((this->super_RegionAllocator<unsigned_int>).field_0x14 | learnt);
  }
  RVar1 = RegionAllocator<unsigned_int>::alloc
                    (&this->super_RegionAllocator<unsigned_int>,
                     *(int *)&(ps->header).field_0x4 + _extra_size + 3);
  Clause::Clause<Glucose::Clause>
            ((Clause *)((this->super_RegionAllocator<unsigned_int>).memory + RVar1),ps,_extra_size,
             learnt);
  return RVar1;
}

Assistant:

CRef alloc(const Lits& ps, bool learnt = false, bool imported = false)
        {
            assert(sizeof(Lit)      == sizeof(uint32_t));
            assert(sizeof(float)    == sizeof(uint32_t));

            bool use_extra = learnt | extra_clause_field;
            int extra_size = imported?3:(use_extra?1:0);
            CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), extra_size));
            new (lea(cid)) Clause(ps, extra_size, learnt);

            return cid;
        }